

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  int *piVar1;
  ImVector<unsigned_short> *pIVar2;
  float fVar3;
  float fVar4;
  ImGuiKey key;
  ImGuiInputEvent *pIVar5;
  unsigned_short *puVar6;
  undefined8 uVar7;
  ImGuiInputEventMousePos IVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ImGuiIO *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiKeyData *pIVar17;
  unsigned_short *__dest;
  ImGuiInputEvent *pIVar18;
  char *pcVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  undefined8 *puVar26;
  ulong uVar27;
  undefined7 in_register_00000039;
  long lVar28;
  char *pcVar29;
  int iVar30;
  ulong uVar31;
  bool bVar32;
  undefined4 uVar33;
  ImBitArray<652,_0> key_changed_mask;
  uint local_88 [22];
  
  pIVar16 = GImGui;
  uVar31 = 0;
  bVar32 = false;
  if ((int)CONCAT71(in_register_00000039,trickle_fast_inputs) != 0) {
    bVar32 = GImGui->WantTextInputNextFrame == 1;
  }
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0x14] = 0;
  if (0 < (GImGui->InputEventsQueue).Size) {
    pIVar15 = &GImGui->IO;
    uVar31 = 0;
    lVar28 = 0x10;
    bVar14 = false;
    bVar12 = false;
    bVar11 = false;
    bVar13 = false;
    uVar23 = 0;
    do {
      pIVar5 = (pIVar16->InputEventsQueue).Data;
      switch(*(undefined4 *)((long)pIVar5 + lVar28 + -0x10)) {
      case 1:
        if ((trickle_fast_inputs) && ((((uVar23 != 0 || (bVar12)) || (bVar11)) || (bVar13)))) {
LAB_001eb80f:
          bVar10 = true;
          bVar9 = false;
        }
        else {
          (pIVar16->IO).MousePos = *(ImVec2 *)((long)pIVar5 + lVar28 + -8);
          bVar9 = true;
          bVar10 = false;
          bVar14 = true;
        }
        goto LAB_001eba1e;
      case 2:
        if ((trickle_fast_inputs) && (bVar10 = true, uVar23 != 0 || bVar14)) break;
        (pIVar16->IO).MouseWheelH =
             *(float *)((long)pIVar5 + lVar28 + -8) + (pIVar16->IO).MouseWheelH;
        (pIVar16->IO).MouseWheel = *(float *)((long)pIVar5 + lVar28 + -4) + (pIVar16->IO).MouseWheel
        ;
        bVar12 = true;
      default:
switchD_001eb77a_default:
        bVar10 = false;
        break;
      case 3:
        uVar20 = *(uint *)((long)pIVar5 + lVar28 + -8);
        if ((trickle_fast_inputs) && (((uVar23 >> (uVar20 & 0x1f) & 1) != 0 || (bVar12))))
        goto LAB_001eb80f;
        (pIVar16->IO).MouseDown[(int)uVar20] = *(bool *)((long)pIVar5 + lVar28 + -4);
        uVar23 = uVar23 | 1 << (uVar20 & 0x1f);
        bVar10 = false;
        bVar9 = true;
LAB_001eba1e:
        if (bVar9) goto switchD_001eb77a_default;
        break;
      case 4:
        key = *(ImGuiKey *)((long)pIVar5 + lVar28 + -8);
        pIVar17 = GetKeyData(key);
        uVar27 = (ulong)((long)pIVar17 - (long)pIVar15->KeysData) >> 4;
        uVar20 = (uint)uVar27;
        if ((trickle_fast_inputs) && (pIVar17->Down != (bool)*(char *)((long)pIVar5 + lVar28 + -4)))
        {
          bVar9 = false;
          bVar10 = true;
          if (((local_88[(int)uVar20 >> 5] >> (uVar20 & 0x1f) & 1) == 0) &&
             ((!bVar13 && (uVar23 == 0)))) goto LAB_001eb87b;
        }
        else {
LAB_001eb87b:
          pIVar17->Down = *(bool *)((long)pIVar5 + lVar28 + -4);
          pIVar17->AnalogValue = *(float *)((long)&pIVar5->Type + lVar28);
          local_88[(int)uVar20 >> 5] = local_88[(int)uVar20 >> 5] | 1 << ((byte)uVar27 & 0x1f);
          switch(key << 0x14 | key - ImGuiKey_ModCtrl >> 0xc) {
          case ImGuiKey_KeysData_OFFSET:
            (pIVar16->IO).KeyCtrl = pIVar17->Down;
            if (key != ImGuiKey_ModSuper) {
              if (key != ImGuiKey_ModAlt) {
                if (key == ImGuiKey_ModShift) goto switchD_001eb8c6_caseD_1;
                goto LAB_001eb918;
              }
              goto switchD_001eb8c6_caseD_3;
            }
            break;
          case 1:
switchD_001eb8c6_caseD_1:
            (pIVar16->IO).KeyShift = pIVar17->Down;
            if (key != ImGuiKey_ModSuper) {
              if (key == ImGuiKey_ModAlt) goto switchD_001eb8c6_caseD_3;
              goto LAB_001eb918;
            }
            break;
          default:
            goto switchD_001eb8c6_caseD_2;
          case 3:
switchD_001eb8c6_caseD_3:
            (pIVar16->IO).KeyAlt = pIVar17->Down;
            if (key == ImGuiKey_ModSuper) break;
            goto LAB_001eb918;
          case 7:
            break;
          }
          (pIVar16->IO).KeySuper = pIVar17->Down;
LAB_001eb918:
          iVar24 = (uint)(GImGui->IO).KeyCtrl * 0x1000;
          iVar30 = iVar24 + 0x2000;
          if ((GImGui->IO).KeyShift == false) {
            iVar30 = iVar24;
          }
          iVar24 = iVar30 + 0x4000;
          if ((GImGui->IO).KeyAlt == false) {
            iVar24 = iVar30;
          }
          iVar30 = iVar24 + 0x8000;
          if ((GImGui->IO).KeySuper == false) {
            iVar30 = iVar24;
          }
          (pIVar16->IO).KeyMods = iVar30;
switchD_001eb8c6_caseD_2:
          (pIVar16->IO).KeysDown[(int)uVar20] = pIVar17->Down;
          lVar25 = (long)(pIVar16->IO).KeyMap[(int)uVar20];
          bVar10 = false;
          if (lVar25 != -1) {
            (pIVar16->IO).KeysDown[lVar25] = pIVar17->Down;
          }
          bVar9 = true;
          bVar11 = true;
        }
        if (bVar9) goto switchD_001eb77a_default;
        break;
      case 5:
        if (!trickle_fast_inputs) {
LAB_001eba4e:
          uVar20 = *(uint *)((long)pIVar5 + lVar28 + -8);
          if (0xffff < uVar20) {
            uVar20 = 0xfffd;
          }
          iVar24 = (pIVar16->IO).InputQueueCharacters.Size;
          iVar30 = (pIVar16->IO).InputQueueCharacters.Capacity;
          if (iVar24 == iVar30) {
            if (iVar30 == 0) {
              iVar21 = 8;
            }
            else {
              iVar21 = iVar30 / 2 + iVar30;
            }
            iVar24 = iVar24 + 1;
            if (iVar24 < iVar21) {
              iVar24 = iVar21;
            }
            if (iVar30 < iVar24) {
              if (GImGui != (ImGuiContext *)0x0) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + 1;
              }
              __dest = (unsigned_short *)
                       (*GImAllocatorAllocFunc)((long)iVar24 * 2,GImAllocatorUserData);
              puVar6 = (pIVar16->IO).InputQueueCharacters.Data;
              if (puVar6 != (unsigned_short *)0x0) {
                memcpy(__dest,puVar6,(long)(pIVar16->IO).InputQueueCharacters.Size * 2);
                puVar6 = (pIVar16->IO).InputQueueCharacters.Data;
                if ((puVar6 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + -1;
                }
                (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
              }
              (pIVar16->IO).InputQueueCharacters.Data = __dest;
              (pIVar16->IO).InputQueueCharacters.Capacity = iVar24;
            }
          }
          (pIVar16->IO).InputQueueCharacters.Data[(pIVar16->IO).InputQueueCharacters.Size] =
               (unsigned_short)uVar20;
          pIVar2 = &(pIVar16->IO).InputQueueCharacters;
          pIVar2->Size = pIVar2->Size + 1;
          if (bVar32) {
            bVar13 = true;
          }
          goto switchD_001eb77a_default;
        }
        if (bVar11) {
          bVar10 = true;
          if (uVar23 == 0 && !bVar32) {
LAB_001eba39:
            bVar10 = true;
            if ((!bVar14) && (!bVar12)) goto LAB_001eba4e;
          }
        }
        else {
          bVar10 = true;
          if (uVar23 == 0) goto LAB_001eba39;
        }
        break;
      case 6:
        (pIVar16->IO).AppFocusLost = (bool)(*(byte *)((long)pIVar5 + lVar28 + -8) ^ 1);
        goto switchD_001eb77a_default;
      }
      if (bVar10) break;
      uVar31 = uVar31 + 1;
      lVar28 = lVar28 + 0x18;
    } while ((long)uVar31 < (long)(pIVar16->InputEventsQueue).Size);
  }
  iVar24 = (int)uVar31;
  uVar31 = uVar31 & 0xffffffff;
  if (iVar24 != 0) {
    lVar28 = 0;
    do {
      puVar26 = (undefined8 *)((long)&((pIVar16->InputEventsQueue).Data)->Type + lVar28);
      iVar30 = (pIVar16->InputEventsTrail).Size;
      iVar21 = (pIVar16->InputEventsTrail).Capacity;
      if (iVar30 == iVar21) {
        if (iVar21 == 0) {
          iVar22 = 8;
        }
        else {
          iVar22 = iVar21 / 2 + iVar21;
        }
        iVar30 = iVar30 + 1;
        if (iVar30 < iVar22) {
          iVar30 = iVar22;
        }
        if (iVar21 < iVar30) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar18 = (ImGuiInputEvent *)
                    (*GImAllocatorAllocFunc)((long)iVar30 * 0x18,GImAllocatorUserData);
          pIVar5 = (pIVar16->InputEventsTrail).Data;
          if (pIVar5 != (ImGuiInputEvent *)0x0) {
            memcpy(pIVar18,pIVar5,(long)(pIVar16->InputEventsTrail).Size * 0x18);
            pIVar5 = (pIVar16->InputEventsTrail).Data;
            if ((pIVar5 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
          }
          (pIVar16->InputEventsTrail).Data = pIVar18;
          (pIVar16->InputEventsTrail).Capacity = iVar30;
        }
      }
      pIVar5 = (pIVar16->InputEventsTrail).Data;
      iVar30 = (pIVar16->InputEventsTrail).Size;
      *(undefined8 *)((long)&pIVar5[iVar30].field_2 + 8) = puVar26[2];
      uVar7 = *puVar26;
      IVar8 = *(ImGuiInputEventMousePos *)(puVar26 + 1);
      pIVar5 = pIVar5 + iVar30;
      pIVar5->Type = (int)uVar7;
      pIVar5->Source = (int)((ulong)uVar7 >> 0x20);
      (pIVar5->field_2).MousePos = IVar8;
      (pIVar16->InputEventsTrail).Size = (pIVar16->InputEventsTrail).Size + 1;
      lVar28 = lVar28 + 0x18;
    } while (uVar31 * 0x18 != lVar28);
    if (((pIVar16->DebugLogFlags & 0x20) != 0) && (0 < (pIVar16->InputEventsQueue).Size)) {
      lVar28 = 0xc;
      uVar27 = 0;
      do {
        pcVar29 = "Remaining";
        if (uVar27 < uVar31) {
          pcVar29 = "Processed";
        }
        pIVar5 = (pIVar16->InputEventsQueue).Data;
        switch(*(undefined4 *)((long)pIVar5 + lVar28 + -0xc)) {
        case 1:
          fVar4 = *(float *)((long)pIVar5 + lVar28 + -4);
          if ((((fVar4 != -3.4028235e+38) || (NAN(fVar4))) ||
              (fVar3 = *(float *)((long)&pIVar5->Type + lVar28), fVar3 != -3.4028235e+38)) ||
             (NAN(fVar3))) {
            if ((GImGui->DebugLogFlags & 0x20) != 0) {
              uVar33 = SUB84((double)fVar4,0);
              fVar4 = *(float *)((long)&pIVar5->Type + lVar28);
              pcVar19 = "%s: MousePos (%.1f, %.1f)\n";
              goto LAB_001ebe95;
            }
          }
          else if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: MousePos (-FLT_MAX, -FLT_MAX)\n",pcVar29);
          }
          break;
        case 2:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            uVar33 = SUB84((double)*(float *)((long)pIVar5 + lVar28 + -4),0);
            fVar4 = *(float *)((long)&pIVar5->Type + lVar28);
            pcVar19 = "%s: MouseWheel (%.1f, %.1f)\n";
LAB_001ebe95:
            DebugLog(pcVar19,uVar33,(double)fVar4,pcVar29);
          }
          break;
        case 3:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: MouseButton %d %s\n",pcVar29,(ulong)*(uint *)((long)pIVar5 + lVar28 + -4))
            ;
          }
          break;
        case 4:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            pcVar19 = GetKeyName(*(ImGuiKey *)((long)pIVar5 + lVar28 + -4));
            DebugLog("%s: Key \"%s\" %s\n",pcVar29,pcVar19);
          }
          break;
        case 5:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: Text: %c (U+%08X)\n",pcVar29,(ulong)*(uint *)((long)pIVar5 + lVar28 + -4))
            ;
          }
          break;
        case 6:
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            DebugLog("%s: AppFocused %d\n",pcVar29,(ulong)*(byte *)((long)pIVar5 + lVar28 + -4));
          }
        }
        uVar27 = uVar27 + 1;
        lVar28 = lVar28 + 0x18;
      } while ((long)uVar27 < (long)(pIVar16->InputEventsQueue).Size);
    }
  }
  iVar30 = (pIVar16->InputEventsQueue).Size;
  if (iVar24 == iVar30) {
    iVar30 = (pIVar16->InputEventsQueue).Capacity;
    iVar24 = 0;
    if (iVar30 < 0) {
      uVar23 = iVar30 / 2 + iVar30;
      uVar31 = 0;
      if (0 < (int)uVar23) {
        uVar31 = (ulong)uVar23;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar18 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(uVar31 * 0x18,GImAllocatorUserData);
      pIVar5 = (pIVar16->InputEventsQueue).Data;
      if (pIVar5 != (ImGuiInputEvent *)0x0) {
        memcpy(pIVar18,pIVar5,(long)(pIVar16->InputEventsQueue).Size * 0x18);
        pIVar5 = (pIVar16->InputEventsQueue).Data;
        if ((pIVar5 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar16->InputEventsQueue).Data = pIVar18;
      (pIVar16->InputEventsQueue).Capacity = (int)uVar31;
      iVar24 = 0;
    }
  }
  else {
    pIVar5 = (pIVar16->InputEventsQueue).Data;
    memmove(pIVar5,pIVar5 + uVar31,((long)iVar30 - uVar31) * 0x18);
    iVar24 = (pIVar16->InputEventsQueue).Size - iVar24;
  }
  (pIVar16->InputEventsQueue).Size = iVar24;
  if ((pIVar16->IO).AppFocusLost == true) {
    ImGuiIO::ClearInputKeys(&pIVar16->IO);
    return;
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            // Trickling Rule: Stop processing queued events if we already handled a mouse button change
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                break;
            io.MousePos = event_pos;
            mouse_moved = true;
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                break;
            io.MouseDown[button] = e->MouseButton.Down;
            mouse_button_changed |= (1 << button);
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the event
            if (trickle_fast_inputs && (mouse_moved || mouse_button_changed != 0))
                break;
            io.MouseWheelH += e->MouseWheel.WheelX;
            io.MouseWheel += e->MouseWheel.WheelY;
            mouse_wheeled = true;
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            ImGuiKeyData* key_data = GetKeyData(key);
            const int key_data_index = (int)(key_data - g.IO.KeysData);
            if (trickle_fast_inputs && key_data->Down != e->Key.Down && (key_changed_mask.TestBit(key_data_index) || text_inputted || mouse_button_changed != 0))
                break;
            key_data->Down = e->Key.Down;
            key_data->AnalogValue = e->Key.AnalogValue;
            key_changed = true;
            key_changed_mask.SetBit(key_data_index);

            if (key == ImGuiMod_Ctrl || key == ImGuiMod_Shift || key == ImGuiMod_Alt || key == ImGuiMod_Super)
            {
                if (key == ImGuiMod_Ctrl) { io.KeyCtrl = key_data->Down; }
                if (key == ImGuiMod_Shift) { io.KeyShift = key_data->Down; }
                if (key == ImGuiMod_Alt) { io.KeyAlt = key_data->Down; }
                if (key == ImGuiMod_Super) { io.KeySuper = key_data->Down; }
                io.KeyMods = GetMergedModsFromBools();
            }

            // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
            io.KeysDown[key_data_index] = key_data->Down;
            if (io.KeyMap[key_data_index] != -1)
                io.KeysDown[io.KeyMap[key_data_index]] = key_data->Down;
#endif
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process in NewFrame(), in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            const bool focus_lost = !e->AppFocused.Focused;
            io.AppFocusLost = focus_lost;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG_IO("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (event_n != 0 && (g.DebugLogFlags & ImGuiDebugLogFlags_EventIO))
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugPrintInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);
#endif

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // - this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle.
    // - we clear in EndFrame() and not now in order allow application/user code polling this flag
    //   (e.g. custom backend may want to clear additional data, custom widgets may want to react with a "canceling" event).
    if (g.IO.AppFocusLost)
        g.IO.ClearInputKeys();
}